

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3UpsertDelete(sqlite3 *db,Upsert *p)

{
  if (p != (Upsert *)0x0) {
    sqlite3ExprListDelete(db,p->pUpsertTarget);
    sqlite3ExprDelete(db,p->pUpsertTargetWhere);
    sqlite3ExprListDelete(db,p->pUpsertSet);
    sqlite3ExprDelete(db,p->pUpsertWhere);
    sqlite3DbFreeNN(db,p);
    return;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3UpsertDelete(sqlite3 *db, Upsert *p){
  if( p ){
    sqlite3ExprListDelete(db, p->pUpsertTarget);
    sqlite3ExprDelete(db, p->pUpsertTargetWhere);
    sqlite3ExprListDelete(db, p->pUpsertSet);
    sqlite3ExprDelete(db, p->pUpsertWhere);
    sqlite3DbFree(db, p);
  }
}